

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int Ifn_NtkParseInt_rec(char *pStr,Ifn_Ntk_t *p,char **ppFinal,int *piNode)

{
  uint uVar1;
  int iVar2;
  Ifn_Ntk_t *pIVar3;
  long lVar4;
  char *pLim;
  int local_68;
  int Type;
  int pFanins [11];
  int nFanins;
  Ifn_Obj_t *pObj;
  int *piNode_local;
  char **ppFinal_local;
  Ifn_Ntk_t *p_local;
  char *pStr_local;
  
  pFanins[9] = 0;
  p_local = (Ifn_Ntk_t *)pStr;
  uVar1 = Inf_ManOpenSymb(pStr);
  pIVar3 = p_local;
  p_local = (Ifn_Ntk_t *)((long)&p_local->nInps + 1);
  pIVar3 = (Ifn_Ntk_t *)
           Ifn_NtkParseFindClosingParenthesis
                     ((char *)pIVar3,*Ifn_Symbs[(int)uVar1],Ifn_Symbs[(int)uVar1][1]);
  *ppFinal = (char *)0x0;
  if (pIVar3 == (Ifn_Ntk_t *)0x0) {
    pStr_local._4_4_ =
         Ifn_ErrorMessage("For symbol \'%c\' cannot find matching symbol \'%c\'.\n",
                          (ulong)(uint)(int)*Ifn_Symbs[(int)uVar1],
                          (ulong)(uint)(int)Ifn_Symbs[(int)uVar1][1]);
  }
  else {
    while (p_local < pIVar3) {
      if (10 < pFanins[9]) {
        __assert_fail("nFanins < IFN_INS",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                      ,0x106,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
      }
      if (((char)p_local->nInps < 'a') || ('z' < (char)p_local->nInps)) {
        iVar2 = Inf_ManOpenSymb((char *)p_local);
        if (iVar2 == 0) {
          iVar2 = Ifn_ErrorMessage("Substring \"%s\" contans unrecognized symbol \'%c\'.\n",p_local,
                                   (ulong)(uint)(int)(char)p_local->nInps);
          return iVar2;
        }
        iVar2 = Ifn_NtkParseInt_rec((char *)p_local,p,(char **)&p_local,piNode);
        if (iVar2 == 0) {
          return 0;
        }
        lVar4 = (long)pFanins[9];
        pFanins[9] = pFanins[9] + 1;
        (&local_68)[lVar4] = *piNode + -1;
      }
      else {
        lVar4 = (long)pFanins[9];
        pFanins[9] = pFanins[9] + 1;
        (&local_68)[lVar4] = (char)p_local->nInps + -0x61;
        p_local = (Ifn_Ntk_t *)((long)&p_local->nInps + 1);
      }
    }
    if (p_local != pIVar3) {
      __assert_fail("pStr == pLim",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                    ,0x112,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
    }
    iVar2 = *piNode;
    *piNode = iVar2 + 1;
    register0x00000000 = p->Nodes + iVar2;
    *(uint *)register0x00000000 = *(uint *)register0x00000000 & 0xfffffff8 | uVar1 & 7;
    if ((*(uint *)register0x00000000 >> 3 & 0x1f) != 0) {
      __assert_fail("pObj->nFanins == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                    ,0x115,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
    }
    *(uint *)register0x00000000 =
         *(uint *)register0x00000000 & 0xffffff07 | (pFanins[9] & 0x1fU) << 3;
    memcpy(register0x00000000->Fanins,&local_68,(long)pFanins[9] << 2);
    *ppFinal = (char *)((long)&pIVar3->nInps + 1);
    if ((uVar1 == 5) && (pFanins[9] != 3)) {
      pStr_local._4_4_ = Ifn_ErrorMessage("MUX should have exactly three fanins.\n");
    }
    else {
      pStr_local._4_4_ = 1;
    }
  }
  return pStr_local._4_4_;
}

Assistant:

int Ifn_NtkParseInt_rec( char * pStr, Ifn_Ntk_t * p, char ** ppFinal, int * piNode )
{
    Ifn_Obj_t * pObj;
    int nFanins = 0, pFanins[IFN_INS];
    int Type = Inf_ManOpenSymb( pStr );
    char * pLim = Ifn_NtkParseFindClosingParenthesis( pStr++, Ifn_Symbs[Type][0], Ifn_Symbs[Type][1] );
    *ppFinal = NULL;
    if ( pLim == NULL )
        return Ifn_ErrorMessage( "For symbol \'%c\' cannot find matching symbol \'%c\'.\n", Ifn_Symbs[Type][0], Ifn_Symbs[Type][1] );
    while ( pStr < pLim )
    {
        assert( nFanins < IFN_INS );
        if ( pStr[0] >= 'a' && pStr[0] <= 'z' )
            pFanins[nFanins++] = pStr[0] - 'a', pStr++; 
        else if ( Inf_ManOpenSymb(pStr) )
        {
            if ( !Ifn_NtkParseInt_rec( pStr, p, &pStr, piNode ) )
                return 0;
            pFanins[nFanins++] = *piNode - 1;
        }
        else
            return Ifn_ErrorMessage( "Substring \"%s\" contans unrecognized symbol \'%c\'.\n", pStr, pStr[0] );
    }
    assert( pStr == pLim );
    pObj = p->Nodes + (*piNode)++;
    pObj->Type = Type;
    assert( pObj->nFanins == 0 );
    pObj->nFanins = nFanins;
    memcpy( pObj->Fanins, pFanins, sizeof(int) * nFanins );
    *ppFinal = pLim + 1;
    if ( Type == IFN_DSD_MUX && nFanins != 3 )
        return Ifn_ErrorMessage( "MUX should have exactly three fanins.\n" );
    return 1;
}